

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:410:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:410:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  runtime_error *this_01;
  InstancingMode IVar3;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_60,
             &this_00->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar2 == 0) {
    IVar3 = INSTANCING_NONE;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    IVar3 = INSTANCING_GEOMETRY;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar2 == 0) {
        IVar3 = INSTANCING_GROUP;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_60);
          IVar3 = INSTANCING_GROUP;
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_60);
            if (iVar2 == 0) {
              IVar3 = INSTANCING_FLATTENED;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_60);
              IVar3 = INSTANCING_MULTI_LEVEL;
              if (iVar2 != 0) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_40,"unknown instancing mode: ",&local_60);
                std::runtime_error::runtime_error(this_01,(string *)&local_40);
                __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
          }
        }
      }
    }
  }
  pSVar1->instancing_mode = IVar3;
  g_instancing_mode = IVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }